

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O3

int __thiscall GF2::BFunc<8UL>::Deg(BFunc<8UL> *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  uint uVar3;
  MP<8UL,_GF2::MOLex<8UL>_> poly;
  _List_node_base local_40;
  long local_30;
  
  local_30 = 0;
  local_40._M_next = &local_40;
  local_40._M_prev = &local_40;
  BFunc<8ul>::To<GF2::MOLex<8ul>>((BFunc<8ul> *)this,(MP<8UL,_GF2::MOLex<8UL>_> *)&local_40);
  p_Var2 = local_40._M_next;
  if (local_30 == 0) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = 0;
    for (p_Var1 = local_40._M_next; p_Var1 != &local_40;
        p_Var1 = (((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var1->_M_next)->
                 super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
                 super__List_node_base._M_next) {
      if (uVar3 <= (byte)WW<8ul>::Weight()::_bitsperoctet[*(byte *)&p_Var1[1]._M_next]) {
        uVar3 = (uint)(byte)WW<8ul>::Weight()::_bitsperoctet[*(byte *)&p_Var1[1]._M_next];
      }
    }
  }
  while (p_Var2 != &local_40) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return uVar3;
}

Assistant:

int Deg() const
	{	
		MP<_n> poly;
		To(poly);
		return poly.Deg();
	}